

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# px_config.c
# Opt level: O1

int katherine_px_config_load_bmc_file(katherine_px_config_t *px_config,char *file_path)

{
  FILE *__stream;
  katherine_bmc_t *bmc;
  size_t sVar1;
  int *piVar2;
  int iVar3;
  
  __stream = fopen(file_path,"rb");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    iVar3 = *piVar2;
  }
  else {
    bmc = (katherine_bmc_t *)malloc(0x10000);
    if (bmc == (katherine_bmc_t *)0x0) {
      iVar3 = 0xc;
    }
    else {
      sVar1 = fread(bmc,1,0x10000,__stream);
      iVar3 = 5;
      if (sVar1 == 0x10000) {
        katherine_px_config_load_bmc_data(px_config,bmc);
        iVar3 = 0;
      }
      free(bmc);
    }
    fclose(__stream);
  }
  return iVar3;
}

Assistant:

int
katherine_px_config_load_bmc_file(katherine_px_config_t *px_config, const char *file_path)
{
    int res = 0;

    const size_t expected_size = sizeof(katherine_bmc_t);
    FILE* file = fopen(file_path, "rb");
    if (file == NULL) {
        res = errno;
        goto err_fopen;
    }

    katherine_bmc_t *buffer = (katherine_bmc_t *) malloc(expected_size);
    if (buffer == NULL) {
        res = ENOMEM;
        goto err_buffer;
    }

    const size_t actual_size = fread(buffer, 1, expected_size, file);
    if (expected_size != actual_size) {
        res = EIO;
        goto err_fread;
    }

    res = katherine_px_config_load_bmc_data(px_config, buffer);

err_fread:
    free(buffer);    
err_buffer:
    fclose(file);
err_fopen:
    return res;
}